

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O2

uint64_t farmhash64(char *s,size_t len)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t in_R8;
  long lVar4;
  size_t len_00;
  
  if (0x1ff < len) {
    uVar3 = farmhash64_te_long(s,len,0x9ae16a3b2f90404f,0xb492b66fbe98f273);
    return uVar3;
  }
  if (len < 0x21) {
    if (len < 0x11) {
      uVar3 = farmhash_na_len_0_to_16(s,len);
      return uVar3;
    }
    uVar3 = farmhash_na_len_17_to_32(s,len);
    return uVar3;
  }
  if (len < 0x41) {
    len_00 = len * 2 + 0x9ae16a3b2f904031;
    uVar3 = farmhash_xo_h32(s,0x9ae16a3b2f904031,0,0,in_R8);
    uVar1 = farmhash_xo_h32(s + (len - 0x20),len_00,0,0,in_R8);
    lVar4 = uVar1 * len_00 + uVar3;
  }
  else {
    if (0x60 < len) {
      if (len < 0x101) {
        uVar3 = farmhash64_na(s,len);
        return uVar3;
      }
      uVar3 = farmhash64_uo(s,len);
      return uVar3;
    }
    len_00 = len * 2 + 0x9ae16a3b2f903fdd;
    uVar3 = farmhash_xo_h32(s,0x9ae16a3b2f903fdd,0,0,in_R8);
    uVar1 = farmhash_xo_h32(s + 0x20,len_00,0,0,in_R8);
    uVar2 = farmhash_xo_h32(s + (len - 0x20),len_00,uVar3,uVar1,in_R8);
    lVar4 = (uVar1 >> 0x15) + (uVar3 >> 0x11) + uVar2 * 9;
  }
  return lVar4 * len_00;
}

Assistant:

uint64_t farmhash64(const char* s, size_t len) {
  return debug_tweak64(
#if CAN_USE_SSE41 && CAN_USE_SSE42 && x86_64
      farmhash64_te(s, len)
#else
      farmhash64_xo(s, len)
#endif
  );
}